

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall
kratos::VerifyAssignmentVisitor::visit(VerifyAssignmentVisitor *this,AssignStmt *stmt)

{
  element_type *peVar1;
  _func_int **value;
  int iVar2;
  int iVar3;
  uint32_t width;
  uint uVar4;
  Const *var;
  StmtException *pSVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  undefined1 auStack_f8 [8];
  shared_ptr<kratos::Const> old_value;
  IRNode *local_b0;
  element_type *peStack_a8;
  undefined1 local_90 [32];
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_70;
  string local_58;
  allocator_type local_31;
  
  peVar1 = (element_type *)stmt->left_;
  var = (Const *)stmt->right_;
  iVar2 = (*(peVar1->super_Var).super_IRNode._vptr_IRNode[7])(peVar1);
  iVar3 = (*(var->super_Var).super_IRNode._vptr_IRNode[7])(var);
  if ((iVar2 != iVar3) && ((var->super_Var).type_ == ConstValue)) {
    Var::as<kratos::Const>((Var *)auStack_f8);
    value = ((IRNode *)((long)auStack_f8 + 0x270))->_vptr_IRNode;
    width = (*(peVar1->super_Var).super_IRNode._vptr_IRNode[7])(peVar1);
    var = Const::constant((int64_t)value,width,
                          SUB41(((IRNode *)((long)auStack_f8 + 0xd0))->verilog_ln,0));
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &(var->super_Var).super_enable_shared_from_this<kratos::Var>);
    stmt->right_ = (Var *)local_58._M_dataplus._M_p;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
    }
    if (old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  iVar2 = (*(peVar1->super_Var).super_IRNode._vptr_IRNode[7])(peVar1);
  iVar3 = (*(var->super_Var).super_IRNode._vptr_IRNode[7])(var);
  if (iVar2 == iVar3) {
    if ((peVar1->super_Var).is_signed_ == (var->super_Var).is_signed_) {
      check_expr(&var->super_Var,&stmt->super_Stmt);
      return;
    }
    pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
    (*(peVar1->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_b0,peVar1);
    (*(var->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_90,var);
    old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(peVar1->super_Var).is_signed_;
    auStack_f8 = (undefined1  [8])local_b0;
    old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_a8;
    format_str_00.size_ = 0x7d7d;
    format_str_00.data_ = (char *)0x3f;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_f8;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_58,
               (detail *)"assignment sign doesn\'t match. left ({0}): {1} right ({2}): {3}",
               format_str_00,args_00);
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)auStack_f8;
    auStack_f8 = (undefined1  [8])stmt;
    old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_70,__l_00,&local_31);
    StmtException::StmtException(pSVar5,&local_58,&local_70);
    __cxa_throw(pSVar5,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
  (*(peVar1->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_b0,peVar1);
  uVar4 = (*(peVar1->super_Var).super_IRNode._vptr_IRNode[7])(peVar1);
  (*(var->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_90,var);
  (*(var->super_Var).super_IRNode._vptr_IRNode[7])(var);
  old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar4;
  auStack_f8 = (undefined1  [8])local_b0;
  old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_a8;
  format_str.size_ = 0x2d2d;
  format_str.data_ = (char *)0x40;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)auStack_f8;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_58,(detail *)"assignment width doesn\'t match. left ({0}): {1} right ({2}): {3}"
             ,format_str,args);
  __l._M_len = 5;
  __l._M_array = (iterator)auStack_f8;
  auStack_f8 = (undefined1  [8])stmt;
  old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_70,__l,&local_31);
  StmtException::StmtException(pSVar5,&local_58,&local_70);
  __cxa_throw(pSVar5,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit(AssignStmt* stmt) override {
        auto* const left = stmt->left();
        auto* right = stmt->right();
        // if the right hand side is a const and it's safe to do so, we will let it happen
        if (left->width() != right->width()) {
            if (right->type() == VarType::ConstValue) {
                auto old_value = right->as<Const>();
                try {
                    auto& new_const =
                        constant(old_value->value(), left->width(), old_value->is_signed());
                    stmt->set_right(new_const.shared_from_this());
                    right = &new_const;
                } catch (::runtime_error&) {
                    std::cerr << "Failed to convert constants. Expect an exception" << std::endl;
                }
            }
        }
        if (left->width() != right->width())
            throw StmtException(
                ::format("assignment width doesn't match. left ({0}): {1} right ({2}): {3}",
                         left->to_string(), left->width(), right->to_string(), right->width()),
                {stmt, left, right, left->width_param(), right->width_param()});
        if (left->is_signed() != right->is_signed())
            throw StmtException(
                ::format("assignment sign doesn't match. left ({0}): {1} right ({2}): {3}",
                         left->to_string(), left->is_signed(), right->to_string(),
                         right->is_signed()),
                {stmt, left, right, left->width_param(), right->width_param()});
        check_expr(right, stmt);
    }